

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::Add(RepeatedField<double> *this,double *value)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  double tmp;
  uint32_t size;
  double *value_local;
  RepeatedField<double> *this_local;
  
  uVar2 = this->current_size_;
  if (uVar2 == this->total_size_) {
    dVar1 = *value;
    Reserve(this,this->total_size_ + 1);
    pdVar3 = elements(this);
    pdVar3[uVar2] = dVar1;
  }
  else {
    dVar1 = *value;
    pdVar3 = elements(this);
    pdVar3[uVar2] = dVar1;
  }
  this->current_size_ = uVar2 + 1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(const Element& value) {
  uint32_t size = current_size_;
  if (static_cast<int>(size) == total_size_) {
    // value could reference an element of the array. Reserving new space will
    // invalidate the reference. So we must make a copy first.
    auto tmp = value;
    Reserve(total_size_ + 1);
    elements()[size] = std::move(tmp);
  } else {
    elements()[size] = value;
  }
  current_size_ = size + 1;
}